

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_struct_result_writer
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,bool pointers)

{
  t_field *ptVar1;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  undefined4 extraout_var;
  members_type *this_00;
  ostream *poVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pptVar6;
  string *psVar7;
  t_type *type;
  string local_240;
  string local_220;
  string local_200;
  allocator local_1d9;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  allocator local_189;
  string local_188;
  allocator local_161;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_e0;
  t_field **local_d8;
  byte local_c9;
  undefined1 local_c8 [7];
  bool first;
  string local_a8;
  string local_88;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_68;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string name;
  bool pointers_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  name.field_2._M_local_buf[0xf] = pointers;
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&fields,(string *)CONCAT44(extraout_var,iVar3));
  this_00 = t_struct::get_sorted_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_68);
  if ((this->gen_templates_ & 1U) == 0) {
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"uint32_t ");
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_01,iVar3));
    poVar5 = std::operator<<(poVar5,"::write(::apache::thrift::protocol::TProtocol* oprot) const {")
    ;
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_88,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_88);
    poVar5 = std::operator<<(poVar5,"template <class Protocol_>");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_a8);
    poVar5 = std::operator<<(poVar5,"uint32_t ");
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_00,iVar3));
    poVar5 = std::operator<<(poVar5,"::write(Protocol_* oprot) const {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
  }
  t_generator::indent_up((t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)local_c8,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)local_c8);
  poVar5 = std::operator<<(poVar5,"uint32_t xfer = 0;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_c8);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"xfer += oprot->writeStructBegin(\"");
  poVar5 = std::operator<<(poVar5,(string *)&fields);
  poVar5 = std::operator<<(poVar5,"\");");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  local_c9 = 1;
  local_d8 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
  local_68._M_current = local_d8;
  while( true ) {
    local_e0._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
    bVar2 = __gnu_cxx::operator!=(&local_68,&local_e0);
    if (!bVar2) break;
    if ((local_c9 & 1) == 0) {
      std::operator<<(out," else if ");
    }
    else {
      local_c9 = 0;
      poVar5 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_100,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_100);
      std::operator<<(poVar5,"if ");
      std::__cxx11::string::~string((string *)&local_100);
    }
    poVar5 = std::operator<<(out,"(this->__isset.");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_68);
    psVar7 = t_field::get_name_abi_cxx11_(*pptVar6);
    poVar5 = std::operator<<(poVar5,(string *)psVar7);
    poVar5 = std::operator<<(poVar5,") {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_120);
    poVar5 = std::operator<<(poVar5,"xfer += oprot->writeFieldBegin(");
    poVar5 = std::operator<<(poVar5,"\"");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_68);
    psVar7 = t_field::get_name_abi_cxx11_(*pptVar6);
    poVar5 = std::operator<<(poVar5,(string *)psVar7);
    poVar5 = std::operator<<(poVar5,"\", ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_68);
    type = t_field::get_type(*pptVar6);
    type_to_enum_abi_cxx11_(&local_140,this,type);
    poVar5 = std::operator<<(poVar5,(string *)&local_140);
    poVar5 = std::operator<<(poVar5,", ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_68);
    iVar4 = t_field::get_key(*pptVar6);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    poVar5 = std::operator<<(poVar5,");");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
    if ((name.field_2._M_local_buf[0xf] & 1U) == 0) {
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_68);
      ptVar1 = *pptVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1b0,"this->",&local_1b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1d8,"",&local_1d9);
      generate_serialize_field(this,out,ptVar1,&local_1b0,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    }
    else {
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_68);
      ptVar1 = *pptVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_160,"(*(this->",&local_161);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_188,"))",&local_189);
      generate_serialize_field(this,out,ptVar1,&local_160,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator((allocator<char> *)&local_189);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
    }
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"xfer += oprot->writeFieldEnd();");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::operator<<(poVar5,"}");
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_68);
  }
  poVar5 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_200,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_200);
  poVar5 = std::operator<<(poVar5,"xfer += oprot->writeFieldStop();");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_220,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_220);
  poVar5 = std::operator<<(poVar5,"xfer += oprot->writeStructEnd();");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_240,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_240);
  poVar5 = std::operator<<(poVar5,"return xfer;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  t_generator::indent_down((t_generator *)this);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&fields);
  return;
}

Assistant:

void t_cpp_generator::generate_struct_result_writer(ostream& out,
                                                    t_struct* tstruct,
                                                    bool pointers) {
  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;

  if (gen_templates_) {
    out << indent() << "template <class Protocol_>" << endl << indent() << "uint32_t "
        << tstruct->get_name() << "::write(Protocol_* oprot) const {" << endl;
  } else {
    indent(out) << "uint32_t " << tstruct->get_name()
                << "::write(::apache::thrift::protocol::TProtocol* oprot) const {" << endl;
  }
  indent_up();

  out << endl << indent() << "uint32_t xfer = 0;" << endl << endl;

  indent(out) << "xfer += oprot->writeStructBegin(\"" << name << "\");" << endl;

  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
      out << endl << indent() << "if ";
    } else {
      out << " else if ";
    }

    out << "(this->__isset." << (*f_iter)->get_name() << ") {" << endl;

    indent_up();

    // Write field header
    out << indent() << "xfer += oprot->writeFieldBegin("
        << "\"" << (*f_iter)->get_name() << "\", " << type_to_enum((*f_iter)->get_type()) << ", "
        << (*f_iter)->get_key() << ");" << endl;
    // Write field contents
    if (pointers) {
      generate_serialize_field(out, *f_iter, "(*(this->", "))");
    } else {
      generate_serialize_field(out, *f_iter, "this->");
    }
    // Write field closer
    indent(out) << "xfer += oprot->writeFieldEnd();" << endl;

    indent_down();
    indent(out) << "}";
  }

  // Write the struct map
  out << endl << indent() << "xfer += oprot->writeFieldStop();" << endl << indent()
      << "xfer += oprot->writeStructEnd();" << endl << indent() << "return xfer;" << endl;

  indent_down();
  indent(out) << "}" << endl << endl;
}